

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgparserutils.h
# Opt level: O0

void lunasvg::stripLeadingAndTrailingSpaces(string_view *input)

{
  string_view *input_local;
  
  stripLeadingSpaces(input);
  stripTrailingSpaces(input);
  return;
}

Assistant:

constexpr void stripLeadingAndTrailingSpaces(std::string_view& input)
{
    stripLeadingSpaces(input);
    stripTrailingSpaces(input);
}